

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_add_text_sized(LodePNGInfo *info,char *key,char *str,size_t size)

{
  char *pcVar1;
  void *insize;
  char *pcVar2;
  long in_RDI;
  char **new_strings;
  char **new_keys;
  size_t in_stack_ffffffffffffffc8;
  void *in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  pcVar1 = (char *)lodepng_realloc(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  insize = lodepng_realloc(pcVar1,in_stack_ffffffffffffffc8);
  if (pcVar1 != (char *)0x0) {
    *(char **)(in_RDI + 0x50) = pcVar1;
  }
  if (insize != (void *)0x0) {
    *(void **)(in_RDI + 0x58) = insize;
  }
  if ((pcVar1 == (char *)0x0) || (insize == (void *)0x0)) {
    local_4 = 0x53;
  }
  else {
    *(long *)(in_RDI + 0x48) = *(long *)(in_RDI + 0x48) + 1;
    pcVar2 = alloc_string(pcVar1);
    *(char **)(*(long *)(in_RDI + 0x50) + (*(long *)(in_RDI + 0x48) + -1) * 8) = pcVar2;
    pcVar1 = alloc_string_sized(pcVar1,(size_t)insize);
    *(char **)(*(long *)(in_RDI + 0x58) + (*(long *)(in_RDI + 0x48) + -1) * 8) = pcVar1;
    if ((*(long *)(*(long *)(in_RDI + 0x50) + (*(long *)(in_RDI + 0x48) + -1) * 8) == 0) ||
       (*(long *)(*(long *)(in_RDI + 0x58) + (*(long *)(in_RDI + 0x48) + -1) * 8) == 0)) {
      local_4 = 0x53;
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static unsigned lodepng_add_text_sized(LodePNGInfo* info, const char* key, const char* str, size_t size) {
  char** new_keys = (char**)(lodepng_realloc(info->text_keys, sizeof(char*) * (info->text_num + 1)));
  char** new_strings = (char**)(lodepng_realloc(info->text_strings, sizeof(char*) * (info->text_num + 1)));

  if(new_keys) info->text_keys = new_keys;
  if(new_strings) info->text_strings = new_strings;

  if(!new_keys || !new_strings) return 83; /*alloc fail*/

  ++info->text_num;
  info->text_keys[info->text_num - 1] = alloc_string(key);
  info->text_strings[info->text_num - 1] = alloc_string_sized(str, size);
  if(!info->text_keys[info->text_num - 1] || !info->text_strings[info->text_num - 1]) return 83; /*alloc fail*/

  return 0;
}